

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxUnaryNotBoolean::Emit(FxUnaryNotBoolean *this,VMFunctionBuilder *build)

{
  uint uVar1;
  int opc;
  ExpEmit local_24;
  VMFunctionBuilder *build_local;
  FxUnaryNotBoolean *this_local;
  ExpEmit from;
  
  if (this->Operand->ValueType != (this->super_FxExpression).ValueType) {
    __assert_fail("Operand->ValueType == ValueType",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x3b1,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  if ((this->super_FxExpression).ValueType == (PType *)TypeBool) {
    uVar1 = (*this->Operand->_vptr_FxExpression[7])(this->Operand,build);
    if ((uVar1 & 0x10000) != 0) {
      __assert_fail("!from.Konst",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                    ,0x3b4,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
    }
    VMFunctionBuilder::Emit(build,0x6d,uVar1 & 0xff,uVar1 & 0xff,0);
    opc = VMFunctionBuilder::GetConstantInt(build,1);
    VMFunctionBuilder::Emit(build,0x62,uVar1 & 0xff,uVar1 & 0xff,opc);
    local_24 = SUB43(uVar1,0);
    return local_24;
  }
  __assert_fail("ValueType == TypeBool",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x3b2,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType == ValueType);
	assert(ValueType == TypeBool);
	ExpEmit from = Operand->Emit(build);
	assert(!from.Konst);
	// ~x & 1
	build->Emit(OP_NOT, from.RegNum, from.RegNum, 0);
	build->Emit(OP_AND_RK, from.RegNum, from.RegNum, build->GetConstantInt(1));
	return from;
}